

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O0

void __thiscall llvm::DWARFDebugNames::NameIndex::dumpForeignTUs(NameIndex *this,ScopedPrinter *W)

{
  raw_ostream *this_00;
  unsigned_long *in_R8;
  uint64_t local_70;
  format_object<unsigned_int,_unsigned_long> local_68;
  uint local_34;
  undefined1 auStack_30 [4];
  uint32_t TU;
  DelimitedScope<_[_,__]_> local_20;
  ListScope TUScope;
  ScopedPrinter *W_local;
  NameIndex *this_local;
  
  if ((this->Hdr).super_HeaderPOD.ForeignTypeUnitCount != 0) {
    TUScope.W = W;
    StringRef::StringRef((StringRef *)auStack_30,"Foreign Type Unit signatures");
    DelimitedScope<'[',_']'>::DelimitedScope(&local_20,W,_auStack_30);
    for (local_34 = 0; local_34 < (this->Hdr).super_HeaderPOD.ForeignTypeUnitCount;
        local_34 = local_34 + 1) {
      this_00 = ScopedPrinter::startLine(TUScope.W);
      local_70 = getForeignTUSignature(this,local_34);
      format<unsigned_int,unsigned_long>
                (&local_68,(llvm *)"ForeignTU[%u]: 0x%016lx\n",(char *)&local_34,(uint *)&local_70,
                 in_R8);
      raw_ostream::operator<<(this_00,&local_68.super_format_object_base);
    }
    DelimitedScope<'[',_']'>::~DelimitedScope(&local_20);
  }
  return;
}

Assistant:

void DWARFDebugNames::NameIndex::dumpForeignTUs(ScopedPrinter &W) const {
  if (Hdr.ForeignTypeUnitCount == 0)
    return;

  ListScope TUScope(W, "Foreign Type Unit signatures");
  for (uint32_t TU = 0; TU < Hdr.ForeignTypeUnitCount; ++TU) {
    W.startLine() << format("ForeignTU[%u]: 0x%016" PRIx64 "\n", TU,
                            getForeignTUSignature(TU));
  }
}